

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void post_increment_suite::test_map(void)

{
  bool bVar1;
  pointer ptVar2;
  reference pbVar3;
  basic_variable<std::allocator<char>> *pbVar4;
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_788;
  iterator local_780;
  basic_variable<std::allocator<char>_> local_768;
  iterator local_730;
  basic_variable<std::allocator<char>_> local_718;
  iterator local_6e0;
  basic_variable<std::allocator<char>_> local_6c8;
  iterator local_690;
  basic_variable<std::allocator<char>_> local_678;
  iterator local_640;
  basic_variable<std::allocator<char>_> local_628;
  iterator local_5f0;
  basic_variable<std::allocator<char>_> local_5d8;
  iterator local_5a0;
  basic_variable<std::allocator<char>_> local_588;
  iterator local_550;
  basic_variable<std::allocator<char>_> local_538;
  iterator local_500;
  basic_variable<std::allocator<char>_> local_4e8;
  iterator local_4b0;
  basic_variable<std::allocator<char>_> local_498;
  iterator local_460;
  basic_variable<std::allocator<char>_> local_448;
  iterator local_410;
  basic_variable<std::allocator<char>_> local_3f8;
  iterator local_3c0;
  basic_variable<std::allocator<char>_> local_3a8;
  undefined1 local_370 [8];
  iterator result;
  undefined1 local_328 [8];
  iterator where;
  int local_308 [5];
  bool local_2f1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_2f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2e8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_288;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  local_2f0 = &local_2e8;
  local_2f1 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_2f0,(char (*) [6])"alpha",&local_2f1);
  local_2f0 = &local_288;
  local_308[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_2f0,(char (*) [6])"bravo",local_308);
  local_2f0 = &local_228;
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>
            (local_2f0,(char (*) [8])"charlie",
             (double *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_2f0 = &local_1c8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (local_2f0,(char (*) [6])"delta",(char (*) [9])"hydrogen");
  local_2f0 = &local_168;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_wchar_t_(&)[7],_true>
            (local_2f0,(char (*) [5])"echo",(wchar_t (*) [7])L"helium");
  local_2f0 = &local_108;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char16_t_(&)[8],_true>
            (local_2f0,(char (*) [8])"foxtrot",(char16_t (*) [8])L"lithium");
  local_2f0 = &local_a8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char32_t_(&)[10],_true>
            (local_2f0,(char (*) [5])"golf",(char32_t (*) [10])L"beryllium");
  local_48._0_8_ = &local_2e8;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_788 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_788 = local_788 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_788);
  } while (local_788 != &local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)local_328,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  ptVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_328);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<bool>(ptVar2);
  boost::detail::test_impl
            ("where->same<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x422,"void post_increment_suite::test_map()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,true);
  bVar1 = trial::dynamic::operator==
                    (pbVar3,(basic_variable<std::allocator<char>_> *)
                            &result.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  boost::detail::test_impl
            ("*where == variable(true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x423,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++((iterator *)local_370,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328,0);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_3a8,true);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_3a8);
  boost::detail::test_impl
            ("*result == variable(true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x425,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3c0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_328,&local_3c0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x426,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3c0);
  ptVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_328);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>(ptVar2);
  boost::detail::test_impl
            ("where->same<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x427,"void post_increment_suite::test_map()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3f8,2);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_3f8);
  boost::detail::test_impl
            ("*where == variable(2)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x428,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++(&local_410,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_370,&local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_410);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_448,2);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_448);
  boost::detail::test_impl
            ("*result == variable(2)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x42a,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_460,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_328,&local_460);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x42b,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_460);
  ptVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_328);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>(ptVar2);
  boost::detail::test_impl
            ("where->same<double>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x42c,"void post_increment_suite::test_map()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_498,3.0);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_498);
  boost::detail::test_impl
            ("*where == variable(3.0)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x42d,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++(&local_4b0,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_370,&local_4b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b0);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_4e8,3.0);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_4e8);
  boost::detail::test_impl
            ("*result == variable(3.0)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x42f,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_500,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_328,&local_500);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x430,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_500);
  pbVar4 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_328);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>(pbVar4);
  boost::detail::test_impl
            ("where->same<variable::string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x431,"void post_increment_suite::test_map()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_538,"hydrogen");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_538);
  boost::detail::test_impl
            ("*where == variable(\"hydrogen\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x432,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_538);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++(&local_550,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_370,&local_550);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_550);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_588,"hydrogen");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_588);
  boost::detail::test_impl
            ("*result == variable(\"hydrogen\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x434,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_328,&local_5a0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x435,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5a0);
  pbVar4 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_328);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::wstring>(pbVar4);
  boost::detail::test_impl
            ("where->same<variable::wstring_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x436,"void post_increment_suite::test_map()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5d8,L"helium");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_5d8);
  boost::detail::test_impl
            ("*where == variable(L\"helium\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x437,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++(&local_5f0,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_370,&local_5f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f0);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_628,L"helium");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_628);
  boost::detail::test_impl
            ("*result == variable(L\"helium\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x439,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_640,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_328,&local_640);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x43a,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_640);
  pbVar4 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_328);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u16string>
                    (pbVar4);
  boost::detail::test_impl
            ("where->same<variable::u16string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x43b,"void post_increment_suite::test_map()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_678,L"lithium");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_678);
  boost::detail::test_impl
            ("*where == variable(u\"lithium\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x43c,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++(&local_690,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_370,&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_690);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6c8,L"lithium");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_6c8);
  boost::detail::test_impl
            ("*result == variable(u\"lithium\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x43e,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_328,&local_6e0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x43f,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6e0);
  pbVar4 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_328);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u32string>
                    (pbVar4);
  boost::detail::test_impl
            ("where->same<variable::u32string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x440,"void post_increment_suite::test_map()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_718,L"beryllium");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_718);
  boost::detail::test_impl
            ("*where == variable(U\"beryllium\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x441,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++(&local_730,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_328,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_370,&local_730);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_730);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_768,L"beryllium");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_768);
  boost::detail::test_impl
            ("*result == variable(U\"beryllium\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x443,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_780,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_328,&local_780);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x444,"void post_increment_suite::test_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_780);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_map()
{
    variable data = map::make(
        {
            {"alpha", true},
            {"bravo", 2},
            {"charlie", 3.0},
            {"delta", "hydrogen"},
            {"echo", L"helium"},
            {"foxtrot", u"lithium"},
            {"golf", U"beryllium"}
        });
    variable::iterator where = data.begin();
    TRIAL_PROTOCOL_TEST(where->same<bool>());
    TRIAL_PROTOCOL_TEST(*where == variable(true));
    variable::iterator result = where++;
    TRIAL_PROTOCOL_TEST(*result == variable(true));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<int>());
    TRIAL_PROTOCOL_TEST(*where == variable(2));
    result = where++;
    TRIAL_PROTOCOL_TEST(*result == variable(2));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<double>());
    TRIAL_PROTOCOL_TEST(*where == variable(3.0));
    result = where++;
    TRIAL_PROTOCOL_TEST(*result == variable(3.0));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::string_type>());
    TRIAL_PROTOCOL_TEST(*where == variable("hydrogen"));
    result = where++;
    TRIAL_PROTOCOL_TEST(*result == variable("hydrogen"));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::wstring_type>());
    TRIAL_PROTOCOL_TEST(*where == variable(L"helium"));
    result = where++;
    TRIAL_PROTOCOL_TEST(*result == variable(L"helium"));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::u16string_type>());
    TRIAL_PROTOCOL_TEST(*where == variable(u"lithium"));
    result = where++;
    TRIAL_PROTOCOL_TEST(*result == variable(u"lithium"));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::u32string_type>());
    TRIAL_PROTOCOL_TEST(*where == variable(U"beryllium"));
    result = where++;
    TRIAL_PROTOCOL_TEST(*result == variable(U"beryllium"));
    TRIAL_PROTOCOL_TEST(where == data.end());
}